

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O1

void embree::printCommandLine(int argc,char **argv)

{
  size_t sVar1;
  ulong uVar2;
  char *pcVar3;
  
  if (0 < argc) {
    uVar2 = 0;
    do {
      pcVar3 = argv[uVar2];
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x2fa7f8);
      }
      else {
        sVar1 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,sVar1);
      }
      pcVar3 = "";
      if ((long)uVar2 < (long)(argc + -1)) {
        pcVar3 = " ";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,pcVar3,(ulong)((long)uVar2 < (long)(argc + -1)));
      uVar2 = uVar2 + 1;
    } while ((uint)argc != uVar2);
  }
  if (0 < argc) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    return;
  }
  return;
}

Assistant:

void printCommandLine(int argc, char** argv)
{
  for (int i = 0; i < argc; ++i)
      std::cout << argv[i] << (i < argc-1 ? " " : "");
  if (argc > 0) std::cout <<  std::endl;
}